

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O0

int run_test_spawn_affinity_invalid_mask(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int64_t eval_b;
  int64_t eval_a;
  char local_15;
  int cpumask_size;
  char newmask [1];
  int r;
  
  iVar1 = uv_cpumask_size();
  if (iVar1 < 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x69b,"cpumask_size > 0");
    abort();
  }
  init_process_options("",exit_cb);
  local_15 = '\0';
  options.cpumask_size = 0;
  options.cpumask = &local_15;
  puVar2 = uv_default_loop();
  cpumask_size = uv_spawn(puVar2,&process,&options);
  if (cpumask_size != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x6a5,"r == UV_EINVAL");
    abort();
  }
  if (exit_cb_called != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x6a7,"exit_cb_called == 0");
    abort();
  }
  puVar2 = uv_default_loop();
  close_loop(puVar2);
  puVar2 = uv_default_loop();
  iVar1 = uv_loop_close(puVar2);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-spawn.c"
            ,0x6a9,"0","==","uv_loop_close(uv_default_loop())",0,"==",(long)iVar1);
    abort();
  }
  uv_library_shutdown();
  return 0;
}

Assistant:

TEST_IMPL(spawn_affinity_invalid_mask) {
#if defined(NO_CPU_AFFINITY)
  RETURN_SKIP(NO_CPU_AFFINITY);
#else
  int r;
  char newmask[1];
  int cpumask_size;

  cpumask_size = uv_cpumask_size();
  ASSERT(cpumask_size > 0);

  init_process_options("", exit_cb);

  /* provide a mask that is too small */
  newmask[0] = 0;
  options.cpumask_size = 0;
  options.cpumask = newmask;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == UV_EINVAL);

  ASSERT(exit_cb_called == 0);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
#endif
}